

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

ItemBlock * __thiscall
VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::CreateNewBlock
          (VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *this)

{
  bool bVar1;
  uint uVar2;
  ItemBlock *pIVar3;
  Item *this_00;
  VkAllocationCallbacks *in_RDI;
  uint32_t i;
  ItemBlock newBlock;
  uint32_t newBlockCapacity;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar4;
  
  bVar1 = VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
          ::empty((VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
                   *)&in_RDI->pfnReallocation);
  if (bVar1) {
    uVar2 = *(uint *)&in_RDI->pfnAllocation;
  }
  else {
    pIVar3 = VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
             ::back((VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
                     *)&in_RDI->pfnReallocation);
    uVar2 = pIVar3->Capacity * 3 >> 1;
  }
  this_00 = VmaAllocateArray<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Item>
                      (in_RDI,CONCAT44(uVar2,in_stack_ffffffffffffffc8));
  VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
  ::push_back((VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
               *)this_00,(ItemBlock *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
  ;
  for (uVar4 = 0; uVar4 < uVar2 - 1; uVar4 = uVar4 + 1) {
    this_00[uVar4].NextFreeIndex = uVar4 + 1;
  }
  this_00[uVar2 - 1].NextFreeIndex = 0xffffffff;
  pIVar3 = VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
           ::back((VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
                   *)&in_RDI->pfnReallocation);
  return pIVar3;
}

Assistant:

typename VmaPoolAllocator<T>::ItemBlock& VmaPoolAllocator<T>::CreateNewBlock()
{
    const uint32_t newBlockCapacity = m_ItemBlocks.empty() ?
        m_FirstBlockCapacity : m_ItemBlocks.back().Capacity * 3 / 2;

    const ItemBlock newBlock =
    {
        vma_new_array(m_pAllocationCallbacks, Item, newBlockCapacity),
        newBlockCapacity,
        0
    };

    m_ItemBlocks.push_back(newBlock);

    // Setup singly-linked list of all free items in this block.
    for (uint32_t i = 0; i < newBlockCapacity - 1; ++i)
        newBlock.pItems[i].NextFreeIndex = i + 1;
    newBlock.pItems[newBlockCapacity - 1].NextFreeIndex = UINT32_MAX;
    return m_ItemBlocks.back();
}